

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fpu_helper.c
# Opt level: O0

uint64_t helper_float_cvtps_pw_mips64el(CPUMIPSState_conflict10 *env,uint64_t dt0)

{
  float32 fVar1;
  float32 fVar2;
  uintptr_t unaff_retaddr;
  uint32_t fsth2;
  uint32_t fst2;
  uint64_t dt0_local;
  CPUMIPSState_conflict10 *env_local;
  
  fVar1 = int32_to_float32_mips64el((int32_t)dt0,&(env->active_fpu).fp_status);
  fVar2 = int32_to_float32_mips64el((int32_t)(dt0 >> 0x20),&(env->active_fpu).fp_status);
  update_fcr31(env,unaff_retaddr);
  return CONCAT44(fVar2,fVar1);
}

Assistant:

uint64_t helper_float_cvtps_pw(CPUMIPSState *env, uint64_t dt0)
{
    uint32_t fst2;
    uint32_t fsth2;

    fst2 = int32_to_float32(dt0 & 0XFFFFFFFF, &env->active_fpu.fp_status);
    fsth2 = int32_to_float32(dt0 >> 32, &env->active_fpu.fp_status);
    update_fcr31(env, GETPC());
    return ((uint64_t)fsth2 << 32) | fst2;
}